

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  Expression *pEVar2;
  PoolItem *pPVar3;
  
  pMVar1 = this->newModule;
  pEVar2 = cloneExpression(this,*(Expression **)(__fn + 0x18));
  pPVar3 = PoolAllocator::allocateSpaceForObject(&pMVar1->allocator->pool,0x20);
  *(undefined8 *)&pPVar3->field_0x18 = 0;
  pPVar3[1].size = 0;
  pPVar3->item = &PTR__ReturnValue_00307418;
  pPVar3[1].destructor = (DestructorFn *)pEVar2;
  pPVar3->destructor =
       PoolAllocator::allocate<soul::heart::ReturnValue,_soul::heart::Expression_&>::
       anon_class_1_0_00000001::__invoke;
  return (int)pPVar3 + 0x10;
}

Assistant:

heart::ReturnValue& clone (const heart::ReturnValue& old)
    {
        return newModule.allocate<heart::ReturnValue> (cloneExpression (old.returnValue));
    }